

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.cpp
# Opt level: O1

bool Js::SerializationCloner<Js::StreamWriter>::IsSparseArray(JavascriptArray *arr)

{
  uint uVar1;
  BOOL BVar2;
  bool bVar3;
  
  uVar1 = (arr->super_ArrayObject).length;
  if (uVar1 < 0x11) {
    bVar3 = false;
  }
  else {
    BVar2 = JavascriptOperators::HasOwnItem((RecyclableObject *)arr,uVar1 >> 2);
    bVar3 = true;
    if (BVar2 != 0) {
      BVar2 = JavascriptOperators::HasOwnItem((RecyclableObject *)arr,uVar1 >> 1);
      if (BVar2 != 0) {
        BVar2 = JavascriptOperators::HasOwnItem((RecyclableObject *)arr,(uVar1 >> 1) + (uVar1 >> 2))
        ;
        bVar3 = BVar2 == 0;
      }
    }
  }
  return bVar3;
}

Assistant:

bool SerializationCloner<Writer>::IsSparseArray(JavascriptArray* arr)
    {
        uint32 length = arr->GetLength();
        if (length > SparseArraySegmentBase::HEAD_CHUNK_SIZE)
        {
            // Consider it a sparse array if the array size is non-trivial, and there
            // are empty slots found by some arbitrary sampling.
            return !JavascriptOperators::HasOwnItem(arr, length / 4)
                || !JavascriptOperators::HasOwnItem(arr, length / 2)
                || !JavascriptOperators::HasOwnItem(arr, length / 2 + length / 4);
        }

        return false;
    }